

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasindex.cpp
# Opt level: O0

BOOL __thiscall LASindex::intersect_circle(LASindex *this,F64 center_x,F64 center_y,F64 radius)

{
  U32 UVar1;
  F64 radius_local;
  F64 center_y_local;
  F64 center_x_local;
  LASindex *this_local;
  
  this->have_interval = false;
  UVar1 = LASquadtree::intersect_circle(this->spatial,center_x,center_y,radius);
  this->cells = UVar1;
  if (this->cells == 0) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = merge_intervals(this);
  }
  return this_local._7_1_;
}

Assistant:

BOOL LASindex::intersect_circle(const F64 center_x, const F64 center_y, const F64 radius)
{
  have_interval = FALSE;
  cells = spatial->intersect_circle(center_x, center_y, radius);
//  LASMessage(LAS_VERBOSE, "%d cells of %g/%g %g/%g intersect circle %g/%g/%g", num_cells, spatial->get_min_x(), spatial->get_min_y(), spatial->get_max_x(), spatial->get_max_y(), center_x, center_y, radius);
  if (cells)
    return merge_intervals();
  return FALSE;
}